

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

bool __thiscall
glslang::TSymbolValidater::qualifierCheck
          (TSymbolValidater *this,TType *type1,TType *type2,string *name,bool isBlock)

{
  TInfoSink *pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  TQualifier *this_01;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  char *pcVar4;
  undefined1 local_100 [8];
  string errorStr_5;
  string errorStr_4;
  string errorStr_3;
  string errorStr_2;
  string errorStr_1;
  string errorStr;
  TQualifier *qualifier2;
  TQualifier *qualifier1;
  bool hasError;
  bool isBlock_local;
  string *name_local;
  TType *type2_local;
  TType *type1_local;
  TSymbolValidater *this_local;
  TQualifier *this_00;
  undefined4 extraout_var_00;
  
  qualifier1._6_1_ = false;
  iVar3 = (*type1->_vptr_TType[0xb])();
  this_00 = (TQualifier *)CONCAT44(extraout_var,iVar3);
  iVar3 = (*type2->_vptr_TType[0xb])();
  this_01 = (TQualifier *)CONCAT44(extraout_var_00,iVar3);
  if ((((!isBlock) &&
       (iVar3 = (*type1->_vptr_TType[0xb])(),
       ((uint)*(undefined8 *)(CONCAT44(extraout_var_01,iVar3) + 8) & 0x7f) == 5)) &&
      (iVar3 = (*type2->_vptr_TType[0xb])(),
      ((uint)*(undefined8 *)(CONCAT44(extraout_var_02,iVar3) + 8) & 0x7f) == 5)) ||
     ((iVar3 = (*type1->_vptr_TType[0xb])(),
      ((uint)*(undefined8 *)(CONCAT44(extraout_var_03,iVar3) + 8) & 0x7f) == 1 &&
      (iVar3 = (*type2->_vptr_TType[0xb])(),
      ((uint)*(undefined8 *)(CONCAT44(extraout_var_04,iVar3) + 8) & 0x7f) == 1)))) {
    qualifier1._6_1_ =
         ((uint)(*(ulong *)&this_00->field_0x8 >> 0x19) & 7) !=
         ((uint)(*(ulong *)&this_01->field_0x8 >> 0x19) & 7);
    if (qualifier1._6_1_) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&errorStr_1.field_2 + 8),name,": have precision conflict cross stage.");
      pTVar1 = this->infoSink;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      TInfoSinkBase::message(&pTVar1->info,EPrefixError,pcVar4);
      std::__cxx11::string::~string((string *)(errorStr_1.field_2._M_local_buf + 8));
    }
    bVar2 = TQualifier::hasFormat(this_00);
    if ((bVar2) && (bVar2 = TQualifier::hasFormat(this_01), bVar2)) {
      bVar2 = this_00->field_0x2c != this_01->field_0x2c;
      if (bVar2) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&errorStr_2.field_2 + 8),name,
                       ": have layout format conflict cross stage.");
        pTVar1 = this->infoSink;
        pcVar4 = (char *)std::__cxx11::string::c_str();
        TInfoSinkBase::message(&pTVar1->info,EPrefixError,pcVar4);
        std::__cxx11::string::~string((string *)(errorStr_2.field_2._M_local_buf + 8));
      }
      qualifier1._6_1_ = bVar2 || qualifier1._6_1_;
    }
  }
  if (isBlock) {
    if ((this_00->field_0x10 & 0xf) != (this_01->field_0x10 & 0xf)) {
      qualifier1._6_1_ = true;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&errorStr_3.field_2 + 8),name,
                     ": have layoutPacking conflict cross stage.");
      pTVar1 = this->infoSink;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      TInfoSinkBase::message(&pTVar1->info,EPrefixError,pcVar4);
      std::__cxx11::string::~string((string *)(errorStr_3.field_2._M_local_buf + 8));
    }
    if ((uint)((ulong)*(undefined8 *)&this_00->field_0x8 >> 0x3d) !=
        (uint)((ulong)*(undefined8 *)&this_01->field_0x8 >> 0x3d)) {
      qualifier1._6_1_ = true;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&errorStr_4.field_2 + 8),name,
                     ": have layoutMatrix conflict cross stage.");
      pTVar1 = this->infoSink;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      TInfoSinkBase::message(&pTVar1->info,EPrefixError,pcVar4);
      std::__cxx11::string::~string((string *)(errorStr_4.field_2._M_local_buf + 8));
    }
    if (this_00->layoutOffset != this_01->layoutOffset) {
      qualifier1._6_1_ = true;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&errorStr_5.field_2 + 8),name,
                     ": have layoutOffset conflict cross stage.");
      pTVar1 = this->infoSink;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      TInfoSinkBase::message(&pTVar1->info,EPrefixError,pcVar4);
      std::__cxx11::string::~string((string *)(errorStr_5.field_2._M_local_buf + 8));
    }
    if (this_00->layoutAlign != this_01->layoutAlign) {
      qualifier1._6_1_ = true;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                     name,": have layoutAlign conflict cross stage.");
      pTVar1 = this->infoSink;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      TInfoSinkBase::message(&pTVar1->info,EPrefixError,pcVar4);
      std::__cxx11::string::~string((string *)local_100);
    }
  }
  return qualifier1._6_1_;
}

Assistant:

bool qualifierCheck(const TType* const type1, const TType* const type2, const std::string& name, bool isBlock)
    {
        bool hasError = false;
        const TQualifier& qualifier1 = type1->getQualifier();
        const TQualifier& qualifier2 = type2->getQualifier();

        if (((isBlock == false) &&
            (type1->getQualifier().storage == EvqUniform && type2->getQualifier().storage == EvqUniform)) ||
            (type1->getQualifier().storage == EvqGlobal && type2->getQualifier().storage == EvqGlobal)) {
            if (qualifier1.precision != qualifier2.precision) {
                hasError = true;
                std::string errorStr = name + ": have precision conflict cross stage.";
                infoSink.info.message(EPrefixError, errorStr.c_str());
            }
            if (qualifier1.hasFormat() && qualifier2.hasFormat()) {
                if (qualifier1.layoutFormat != qualifier2.layoutFormat) {
                    hasError = true;
                    std::string errorStr = name + ": have layout format conflict cross stage.";
                    infoSink.info.message(EPrefixError, errorStr.c_str());
                }

            }
        }

        if (isBlock == true) {
            if (qualifier1.layoutPacking != qualifier2.layoutPacking) {
                hasError = true;
                std::string errorStr = name + ": have layoutPacking conflict cross stage.";
                infoSink.info.message(EPrefixError, errorStr.c_str());
            }
            if (qualifier1.layoutMatrix != qualifier2.layoutMatrix) {
                hasError = true;
                std::string errorStr = name + ": have layoutMatrix conflict cross stage.";
                infoSink.info.message(EPrefixError, errorStr.c_str());
            }
            if (qualifier1.layoutOffset != qualifier2.layoutOffset) {
                hasError = true;
                std::string errorStr = name + ": have layoutOffset conflict cross stage.";
                infoSink.info.message(EPrefixError, errorStr.c_str());
            }
            if (qualifier1.layoutAlign != qualifier2.layoutAlign) {
                hasError = true;
                std::string errorStr = name + ": have layoutAlign conflict cross stage.";
                infoSink.info.message(EPrefixError, errorStr.c_str());
            }
        }

        return hasError;
    }